

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O3

bool is_date(uint32_t year,Month month,uint32_t day)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  
  if (day == 0) goto LAB_00112c25;
  if (month < dec) {
    if ((0xa50U >> (month & 0x1f) & 1) != 0) {
      if (0x1e < day) goto LAB_00112c25;
      bVar2 = 1;
      if (month < dec) goto LAB_00112c27;
      goto LAB_00112c58;
    }
    if (month != feb) goto LAB_00112c53;
    if ((year & 3) != 0) {
      bVar3 = false;
LAB_00112c49:
      bVar2 = day < 0x1d | bVar3;
      goto LAB_00112c27;
    }
    uVar1 = year * -0x3d70a3d7 + 0x51eb850;
    if ((uVar1 >> 2 | year * 0x40000000) < 0x28f5c29) {
      if ((day < 0x1e) || (year != ((int)year / 400) * 400)) {
        bVar3 = (uVar1 >> 4 | year * -0x70000000) < 0xa3d70b;
        goto LAB_00112c49;
      }
    }
    else {
      bVar3 = true;
      if (day < 0x1e) goto LAB_00112c49;
    }
  }
  else {
LAB_00112c53:
    if (day < 0x20) {
LAB_00112c58:
      bVar2 = 1;
      goto LAB_00112c27;
    }
  }
LAB_00112c25:
  bVar2 = 0;
LAB_00112c27:
  return (bool)(0x7b1 < year & bVar2);
}

Assistant:

bool is_date(uint32_t year, Month month, uint32_t day)
{
	bool is_valid = year >= 1970;
	bool is_bad_day = day == 0 ||
		(
			(is_30_day_month(month) && day > 30) ||
			(is_31_day_month(month) && day > 31) ||
			(month == Month::feb && 
				((leapyear(year) && day > 29) || (!leapyear(year) && day > 28)))
			);
	is_valid = is_valid && !is_bad_day;
	return is_valid;
}